

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BaseDictionary.h
# Opt level: O2

void __thiscall
JsUtil::
BaseDictionary<JsUtil::CharacterBuffer<char16_t>,_Symbol_*,_Memory::ArenaAllocator,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::HashedEntry,_JsUtil::NoResizeLock>
::Resize(BaseDictionary<JsUtil::CharacterBuffer<char16_t>,_Symbol_*,_Memory::ArenaAllocator,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::HashedEntry,_JsUtil::NoResizeLock>
         *this)

{
  code *pcVar1;
  undefined4 *puVar2;
  int *piVar3;
  bool bVar4;
  hash_t hVar5;
  uint uVar6;
  EntryType *dst;
  long lVar7;
  long lVar8;
  ValueToKey<JsUtil::CharacterBuffer<char16_t>,_Symbol_*> local_68 [16];
  undefined4 *local_58;
  uint local_4c;
  int *local_48;
  int *newBuckets;
  int local_38;
  uint local_34;
  int modIndex;
  
  uVar6 = this->count * 2;
  local_38 = 0x4b;
  local_34 = DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>::GetBucketSize(uVar6,&local_38);
  local_48 = (Type)0x0;
  newBuckets = (int *)0x0;
  if (local_34 == this->bucketCount) {
    dst = AllocateEntries(this,uVar6,true);
    Memory::
    CopyArray<JsUtil::HashedEntry<JsUtil::CharacterBuffer<char16_t>,Symbol*>,Symbol*,Memory::ArenaAllocator>
              (dst,(long)(int)uVar6,this->entries,(long)this->count);
    DeleteEntries(this,this->entries,this->size);
    this->entries = dst;
    this->size = uVar6;
    this->modFunctionIndex = local_38;
  }
  else {
    Allocate(this,&local_48,(EntryType **)&newBuckets,local_34,uVar6);
    local_4c = uVar6;
    Memory::
    CopyArray<JsUtil::HashedEntry<JsUtil::CharacterBuffer<char16_t>,Symbol*>,Symbol*,Memory::ArenaAllocator>
              ((HashedEntry<JsUtil::CharacterBuffer<char16_t>,_Symbol_*> *)newBuckets,
               (long)(int)uVar6,this->entries,(long)this->count);
    this->modFunctionIndex = local_38;
    local_58 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    lVar7 = 0;
    for (lVar8 = 0; piVar3 = newBuckets, lVar8 < this->count; lVar8 = lVar8 + 1) {
      if (-2 < *(int *)((long)newBuckets + lVar7 + 8)) {
        ValueToKey<JsUtil::CharacterBuffer<char16_t>,_Symbol_*>::ToKey
                  (local_68,(Symbol **)((long)newBuckets + lVar7));
        hVar5 = CharacterBuffer::operator_cast_to_unsigned_int((CharacterBuffer *)local_68);
        hVar5 = hVar5 * 2 + 1;
        if (hVar5 != *(hash_t *)((long)piVar3 + lVar7 + 0xc)) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar2 = local_58;
          *local_58 = 1;
          bVar4 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/DictionaryEntry.h"
                             ,0xce,
                             "(((static_cast<hash_t>(Comparer::GetHashCode(this->Key())) << 1) | 1) == this->hashCode)"
                             ,"TAGHASH(Comparer::GetHashCode(this->Key())) == this->hashCode");
          if (!bVar4) {
            pcVar1 = (code *)invalidInstructionException();
            (*pcVar1)();
          }
          *puVar2 = 0;
          hVar5 = *(hash_t *)((long)piVar3 + lVar7 + 0xc);
        }
        uVar6 = GetBucket(hVar5,local_34,this->modFunctionIndex);
        *(int *)((long)newBuckets + lVar7 + 8) = local_48[(int)uVar6];
        local_48[(int)uVar6] = (int)lVar8;
      }
      lVar7 = lVar7 + 0x10;
    }
    DeleteBuckets(this,this->buckets,this->bucketCount);
    DeleteEntries(this,this->entries,this->size);
    uVar6 = local_4c;
    if (this->stats != (DictionaryStats *)0x0) {
      DictionaryStats::Resize(this->stats,local_4c,local_4c - this->size);
    }
    this->buckets = local_48;
    this->entries = (Type)newBuckets;
    this->bucketCount = local_34;
    this->size = uVar6;
  }
  return;
}

Assistant:

void Resize()
        {
            AutoDoResize autoDoResize(*this);

            int newSize = SizePolicy::GetNextSize(count);
            int modIndex = UNKNOWN_MOD_INDEX;
            uint newBucketCount = SizePolicy::GetBucketSize(newSize, &modIndex);

            __analysis_assume(newSize > count);
            int* newBuckets = nullptr;
            EntryType* newEntries = nullptr;
            if (newBucketCount == bucketCount)
            {
                // no need to rehash
                newEntries = AllocateEntries(newSize);
                CopyArray<EntryType, Field(ValueType, TAllocator), TAllocator>(
                    newEntries, newSize, entries, count);

                DeleteEntries(entries, size);

                this->entries = newEntries;
                this->size = newSize;
                this->modFunctionIndex = modIndex;
                return;
            }

            Allocate(&newBuckets, &newEntries, newBucketCount, newSize);
            CopyArray<EntryType, Field(ValueType, TAllocator), TAllocator>(
                newEntries, newSize, entries, count);

            // When TAllocator is of type Recycler, it is possible that the Allocate above causes a collection, which
            // in turn can cause entries in the dictionary to be removed - i.e. the dictionary contains weak references
            // that remove themselves when no longer valid. This means the free list might not be empty anymore.
            this->modFunctionIndex = modIndex;
            for (int i = 0; i < count; i++)
            {
                __analysis_assume(i < newSize);

                if (!IsFreeEntry(newEntries[i]))
                {
                    hash_t hashCode = newEntries[i].template GetHashCode<Comparer<TKey>>();
                    int bucket = GetBucket(hashCode, newBucketCount, modFunctionIndex);
                    newEntries[i].next = newBuckets[bucket];
                    newBuckets[bucket] = i;
                }
            }

            DeleteBuckets(buckets, bucketCount);
            DeleteEntries(entries, size);

#if PROFILE_DICTIONARY
            if (stats)
                stats->Resize(newSize, /*emptyBuckets=*/ newSize - size);
#endif
            this->buckets = newBuckets;
            this->entries = newEntries;
            bucketCount = newBucketCount;
            size = newSize;
        }